

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O1

string * nivalis::nivalis_to_latex_safe(string *__return_storage_ptr__,string *expr_in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  long *plVar5;
  size_type *psVar6;
  string *psVar7;
  long lVar8;
  long *in_FS_OFFSET;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  string expr;
  string local_228;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  undefined1 local_1f8 [24];
  undefined4 local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_228.field_2;
  pcVar2 = (expr_in->_M_dataplus)._M_p;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar2,pcVar2 + expr_in->_M_string_length);
  util::trim(&local_228);
  sVar4 = local_228._M_string_length;
  _Var3._M_p = local_228._M_dataplus._M_p;
  if (local_228._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else if (*local_228._M_dataplus._M_p == '#') {
    std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_228);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x134288);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_1f8._0_8_ = *psVar6;
      local_1f8._8_8_ = plVar5[3];
      local_208 = (undefined1  [8])local_1f8;
    }
    else {
      local_1f8._0_8_ = *psVar6;
      local_208 = (undefined1  [8])*plVar5;
    }
    local_200._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_208);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar8 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_190._M_dataplus._M_p._1_7_,local_190._M_dataplus._M_p._0_1_) !=
        &local_190.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_190._M_dataplus._M_p._1_7_,local_190._M_dataplus._M_p._0_1_),
                      local_190.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"*","");
    src._M_str = _Var3._M_p;
    src._M_len = sVar4;
    to._M_str = "\\cdot ";
    to._M_len = 6;
    util::str_replace((string *)local_208,src,&local_50,to);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<=","");
    src_00._M_str = _Var3._M_p;
    src_00._M_len = sVar4;
    to_00._M_str = "\\le ";
    to_00._M_len = 4;
    util::str_replace((string *)local_208,src_00,&local_70,to_00);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,">=","");
    src_01._M_str = _Var3._M_p;
    src_01._M_len = sVar4;
    to_01._M_str = "\\ge ";
    to_01._M_len = 4;
    util::str_replace((string *)local_208,src_01,&local_90,to_01);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"!=","");
    src_02._M_str = _Var3._M_p;
    src_02._M_len = sVar4;
    to_02._M_str = "\\ne ";
    to_02._M_len = 4;
    util::str_replace((string *)local_208,src_02,&local_b0,to_02);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"&","");
    src_03._M_str = _Var3._M_p;
    src_03._M_len = sVar4;
    to_03._M_str = "\\wedge ";
    to_03._M_len = 7;
    util::str_replace((string *)local_208,src_03,&local_d0,to_03);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"|","");
    src_04._M_str = _Var3._M_p;
    src_04._M_len = sVar4;
    to_04._M_str = "\\vee ";
    to_04._M_len = 5;
    util::str_replace((string *)local_208,src_04,&local_f0,to_04);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"{","");
    src_05._M_str = _Var3._M_p;
    src_05._M_len = sVar4;
    to_05._M_str = "\\left\\{";
    to_05._M_len = 7;
    util::str_replace((string *)local_208,src_05,&local_110,to_05);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"}","");
    src_06._M_str = _Var3._M_p;
    src_06._M_len = sVar4;
    to_06._M_str = "\\right\\}";
    to_06._M_len = 8;
    util::str_replace((string *)local_208,src_06,&local_130,to_06);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    sVar4 = local_228._M_string_length;
    _Var3._M_p = local_228._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"@","");
    src_07._M_str = _Var3._M_p;
    src_07._M_len = sVar4;
    to_07._M_str = "\\operatorname{at} ";
    to_07._M_len = 0x12;
    util::str_replace((string *)local_208,src_07,&local_150,to_07);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((char)in_FS_OFFSET[-0x24] == '\0') {
      in_FS_OFFSET[-0x2e] = *in_FS_OFFSET + -0x160;
      std::__cxx11::string::_M_construct<char_const*>((string *)(*in_FS_OFFSET + -0x170),"sqrt","");
      local_190._M_dataplus._M_p._0_1_ = 0x28;
      psVar7 = &local_170;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_190;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x150),__l,
                 (allocator_type *)psVar7);
      local_208._0_4_ = 0xffffffff;
      local_200._M_p = local_1f8 + 8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\\sqrt{","");
      local_1d8 = local_1c8;
      local_1e0 = 0;
      local_1d0 = 0;
      local_1c8[0] = 0;
      local_1b8 = 0xffffffff;
      plVar5 = local_1a0;
      local_1b0[0] = plVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"}","");
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)local_208;
      std::
      vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
      ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                *)(*in_FS_OFFSET + -0x138),__l_00,(allocator_type *)psVar7);
      lVar8 = -0x78;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -5;
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0);
      __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x170,&__dso_handle
                         );
      *(undefined1 *)(in_FS_OFFSET + -0x24) = 1;
    }
    if ((char)in_FS_OFFSET[-0x19] == '\0') {
      in_FS_OFFSET[-0x23] = *in_FS_OFFSET + -0x108;
      std::__cxx11::string::_M_construct<char_const*>((string *)(*in_FS_OFFSET + -0x118),"abs","");
      local_190._M_dataplus._M_p._0_1_ = 0x28;
      psVar7 = &local_170;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_190;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0xf8),__l_01,
                 (allocator_type *)psVar7);
      local_208._0_4_ = 0xffffffff;
      local_200._M_p = local_1f8 + 8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\\left|","");
      local_1d8 = local_1c8;
      local_1e0 = 0;
      local_1d0 = 0;
      local_1c8[0] = 0;
      local_1b8 = 0xffffffff;
      plVar5 = local_1a0;
      local_1b0[0] = plVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"\\right|","");
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)local_208;
      std::
      vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
      ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                *)(*in_FS_OFFSET + -0xe0),__l_02,(allocator_type *)psVar7);
      lVar8 = -0x78;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -5;
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0);
      __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x118,&__dso_handle
                         );
      *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
    }
    if ((char)in_FS_OFFSET[-0xe] == '\0') {
      in_FS_OFFSET[-0x18] = *in_FS_OFFSET + -0xb0;
      std::__cxx11::string::_M_construct<char_const*>((string *)(*in_FS_OFFSET + -0xc0),"diff","");
      local_190._M_dataplus._M_p._0_1_ = 0x28;
      psVar7 = &local_170;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&local_190;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0xa0),__l_03,
                 (allocator_type *)psVar7);
      local_208._0_4_ = 0xffffffff;
      local_200._M_p = local_1f8 + 8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\\frac{d}{d","");
      local_1d8 = local_1c8;
      local_1e0 = 0;
      local_1d0 = 0;
      local_1c8[0] = 0;
      local_1b8 = 0xffffffff;
      plVar5 = local_1a0;
      local_1b0[0] = plVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"}","");
      __l_04._M_len = 3;
      __l_04._M_array = (iterator)local_208;
      std::
      vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
      ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                *)(*in_FS_OFFSET + -0x88),__l_04,(allocator_type *)psVar7);
      lVar8 = -0x78;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -5;
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0);
      __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0xc0,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -0xe) = 1;
    }
    lVar8 = *in_FS_OFFSET;
    anon_unknown_1::ParenRule::operator()(&local_170,(ParenRule *)(lVar8 + -0x170),&local_228);
    anon_unknown_1::ParenRule::operator()
              (&local_190,(ParenRule *)(*in_FS_OFFSET + -0x118),&local_170);
    anon_unknown_1::ParenRule::operator()
              ((string *)local_208,(ParenRule *)(lVar8 + -0xc0),&local_190);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_190._M_dataplus._M_p._1_7_,local_190._M_dataplus._M_p._0_1_) !=
        &local_190.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_190._M_dataplus._M_p._1_7_,local_190._M_dataplus._M_p._0_1_),
                      local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,local_228.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_228.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_228._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,local_228.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_228._M_string_length;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    local_228._M_dataplus._M_p = (pointer)paVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nivalis_to_latex_safe(const std::string& expr_in) {
    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr[0] == '#') return "\\text{" + expr.substr(1) + "}";
    expr = util::str_replace(expr, "*", "\\cdot ");
    expr = util::str_replace(expr, "<=", "\\le ");
    expr = util::str_replace(expr, ">=", "\\ge ");
    expr = util::str_replace(expr, "!=", "\\ne ");
    expr = util::str_replace(expr, "&", "\\wedge ");
    expr = util::str_replace(expr, "|", "\\vee ");
    expr = util::str_replace(expr, "{", "\\left\\{");
    expr = util::str_replace(expr, "}", "\\right\\}");
    expr = util::str_replace(expr, "@", "\\operatorname{at} ");

    thread_local ParenRule
        n2l_sqrt { "sqrt", {'('}, {"\\sqrt{", 0, "}"} },
        n2l_abs { "abs", {'('}, {"\\left|", 0, "\\right|"} },
        n2l_diff { "diff", {'('}, {"\\frac{d}{d", 0, "}"} };
    expr = n2l_diff(n2l_abs(n2l_sqrt(expr)));
    return expr;
}